

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O2

void __thiscall Subprocess::~Subprocess(Subprocess *this)

{
  if (-1 < this->fd_) {
    close(this->fd_);
  }
  if (this->pid_ != -1) {
    Finish(this);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Subprocess::~Subprocess() {
  if (fd_ >= 0)
    close(fd_);
  // Reap child if forgotten.
  if (pid_ != -1)
    Finish();
}